

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplitLargeMeshes.cpp
# Opt level: O0

void Assimp::SplitLargeMeshesProcess_Triangle::UpdateNode
               (aiNode *pcNode,
               vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               *avList)

{
  ulong uVar1;
  size_type sVar2;
  const_reference pvVar3;
  uint *puVar4;
  reference pvVar5;
  uint local_4c;
  uint local_48;
  uint i_1;
  uint b;
  uint a;
  uint i;
  undefined1 local_30 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> aiEntries;
  vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
  *avList_local;
  aiNode *pcNode_local;
  
  aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)avList;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,
             (ulong)(pcNode->mNumMeshes + 1));
  for (b = 0; b < pcNode->mNumMeshes; b = b + 1) {
    i_1 = 0;
    while( true ) {
      uVar1 = (ulong)i_1;
      sVar2 = std::
              vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
              ::size((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                      *)aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
      if (sVar2 <= uVar1) break;
      pvVar3 = std::
               vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
               ::operator[]((vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                             *)aiEntries.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)i_1);
      if (pvVar3->second == pcNode->mMeshes[b]) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,&i_1);
      }
      i_1 = i_1 + 1;
    }
  }
  if (pcNode->mMeshes != (uint *)0x0) {
    operator_delete__(pcNode->mMeshes);
  }
  sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  pcNode->mNumMeshes = (uint)sVar2;
  puVar4 = (uint *)operator_new__((ulong)pcNode->mNumMeshes << 2);
  pcNode->mMeshes = puVar4;
  for (local_48 = 0; local_48 < pcNode->mNumMeshes; local_48 = local_48 + 1) {
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30,
                        (ulong)local_48);
    pcNode->mMeshes[local_48] = *pvVar5;
  }
  for (local_4c = 0; local_4c < pcNode->mNumChildren; local_4c = local_4c + 1) {
    UpdateNode(pcNode->mChildren[local_4c],
               (vector<std::pair<aiMesh_*,_unsigned_int>,_std::allocator<std::pair<aiMesh_*,_unsigned_int>_>_>
                *)aiEntries.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_30);
  return;
}

Assistant:

void SplitLargeMeshesProcess_Triangle::UpdateNode(aiNode* pcNode,
        const std::vector<std::pair<aiMesh*, unsigned int> >& avList) {
    // for every index in out list build a new entry
    std::vector<unsigned int> aiEntries;
    aiEntries.reserve(pcNode->mNumMeshes + 1);
    for (unsigned int i = 0; i < pcNode->mNumMeshes;++i) {
        for (unsigned int a = 0; a < avList.size();++a) {
            if (avList[a].second == pcNode->mMeshes[i]) {
                aiEntries.push_back(a);
            }
        }
    }

    // now build the new list
    delete[] pcNode->mMeshes;
    pcNode->mNumMeshes = (unsigned int)aiEntries.size();
    pcNode->mMeshes = new unsigned int[pcNode->mNumMeshes];

    for (unsigned int b = 0; b < pcNode->mNumMeshes;++b) {
        pcNode->mMeshes[b] = aiEntries[b];
    }

    // recusively update all other nodes
    for (unsigned int i = 0; i < pcNode->mNumChildren;++i) {
        UpdateNode ( pcNode->mChildren[i], avList );
    }
}